

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::BasicMax::CheckIndexed(BasicMax *this,GLenum target,GLint *min_values)

{
  int *piVar1;
  CallLogWrapper *this_00;
  GLuint c;
  long lVar2;
  GLint i;
  GLint64 i64;
  int local_34;
  int local_30 [2];
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  lVar2 = 0;
  while (lVar2 != 3) {
    glu::CallLogWrapper::glGetIntegeri_v(this_00,target,(GLuint)lVar2,&local_34);
    piVar1 = min_values + lVar2;
    lVar2 = lVar2 + 1;
    if (local_34 < *piVar1) goto LAB_00c25f58;
  }
  lVar2 = 0;
  do {
    if (lVar2 == 3) {
      return true;
    }
    glu::CallLogWrapper::glGetInteger64i_v(this_00,target,(GLuint)lVar2,(GLint64 *)local_30);
    piVar1 = min_values + lVar2;
    lVar2 = lVar2 + 1;
  } while (*piVar1 <= local_30[0]);
LAB_00c25f58:
  anon_unknown_0::Output("Is %d should be at least %d.\n");
  return false;
}

Assistant:

bool CheckIndexed(GLenum target, const GLint* min_values)
	{
		GLint   i;
		GLint64 i64;

		for (GLuint c = 0; c < 3; c++)
		{
			glGetIntegeri_v(target, c, &i);
			if (i < min_values[c])
			{
				Output("Is %d should be at least %d.\n", i, min_values[c]);
				return false;
			}
		}
		for (GLuint c = 0; c < 3; c++)
		{
			glGetInteger64i_v(target, c, &i64);
			if (static_cast<GLint>(i64) < min_values[c])
			{
				Output("Is %d should be at least %d.\n", static_cast<GLint>(i64), min_values[c]);
				return false;
			}
		}

		return true;
	}